

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jansson_helper.c
# Opt level: O0

int get_array_options_inner
              (char *json_string,char *option_name,size_t *count,char ***string_array,
              int **int_array,int is_string_array)

{
  json_t *json;
  json_t *json_00;
  size_t sVar1;
  json_t *json_01;
  longlong lVar2;
  char *pcVar3;
  ulong local_70;
  size_t i;
  int *option_ints;
  char **option_strings;
  json_t *option_item;
  json_t *option_array;
  json_t *root;
  int is_string_array_local;
  int **int_array_local;
  char ***string_array_local;
  size_t *count_local;
  char *option_name_local;
  char *json_string_local;
  
  json = get_root_option_json_object(json_string);
  if (json == (json_t *)0x0) {
    return -1;
  }
  json_00 = json_object_get(json,option_name);
  if (json_00 == (json_t *)0x0) {
    json_decref(json);
    return 0;
  }
  if ((json_00 == (json_t *)0x0) || (json_00->type != JSON_ARRAY)) {
    fprintf(_stderr,"error: option item %s is expected to be a array\n",option_name);
    json_decref(json);
    return -1;
  }
  sVar1 = json_array_size(json_00);
  *count = sVar1;
  if (is_string_array == 0) {
    i = (size_t)malloc(*count << 2);
  }
  else {
    option_ints = (int *)malloc(*count << 3);
    if ((char **)option_ints == (char **)0x0) goto LAB_00106fdb;
  }
  if ((is_string_array != 0) || ((int *)i != (int *)0x0)) {
    local_70 = 0;
    while( true ) {
      if (*count <= local_70) {
        if (is_string_array == 0) {
          *int_array = (int *)i;
        }
        else {
          *string_array = (char **)option_ints;
        }
        json_decref(json);
        return 1;
      }
      json_01 = json_array_get(json_00,local_70);
      if (((is_string_array != 0) && ((json_01 == (json_t *)0x0 || (json_01->type != JSON_STRING))))
         || ((is_string_array == 0 &&
             ((json_01 == (json_t *)0x0 || (json_01->type != JSON_INTEGER)))))) break;
      if (is_string_array == 0) {
        lVar2 = json_integer_value(json_01);
        *(int *)(i + local_70 * 4) = (int)lVar2;
      }
      else {
        pcVar3 = json_string_value(json_01);
        pcVar3 = strdup(pcVar3);
        *(char **)((long)option_ints + local_70 * 8) = pcVar3;
      }
      local_70 = local_70 + 1;
    }
    pcVar3 = "integer";
    if (is_string_array != 0) {
      pcVar3 = "string";
    }
    fprintf(_stderr,"error: option %zu in array %s is expected to be a %s\n",local_70,option_name,
            pcVar3);
    json_decref(json);
    free(option_ints);
    return -1;
  }
LAB_00106fdb:
  fprintf(_stderr,"error: couldn\'t allocate array for option %s (%zu items)\n",option_name,*count);
  json_decref(json);
  return -1;
}

Assistant:

static int get_array_options_inner(const char * json_string, const char * option_name, size_t * count, char *** string_array, int ** int_array, int is_string_array)
{
	json_t * root, *option_array, *option_item;
	char ** option_strings;
	int * option_ints;
	size_t i;

	root = get_root_option_json_object(json_string);
	if (!root)
		return -1;

	option_array = json_object_get(root, option_name);
	if (!option_array)
	{
		json_decref(root);
		return 0;
	}

	if (!json_is_array(option_array))
	{
		fprintf(stderr, "error: option item %s is expected to be a array\n", option_name);
		json_decref(root);
		return -1;
	}

	*count = json_array_size(option_array);
	if(is_string_array)
		option_strings = malloc(*count * sizeof(char *));
	else
		option_ints = malloc(*count * sizeof(int));
	if ((is_string_array && !option_strings) || (!is_string_array && !option_ints))
	{
		fprintf(stderr, "error: couldn't allocate array for option %s (%zu items)\n", option_name, *count);
		json_decref(root);
		return -1;
	}
	for (i = 0; i < *count; i++)
	{
		option_item = json_array_get(option_array, i);
		if ((is_string_array && !json_is_string(option_item)) || (!is_string_array && !json_is_integer(option_item)))
		{
			fprintf(stderr, "error: option %zu in array %s is expected to be a %s\n", i, option_name, is_string_array ? "string" : "integer");
			json_decref(root);
			free(option_strings);
			return -1;
		}
		if(is_string_array)
			option_strings[i] = strdup(json_string_value(option_item));
		else
			option_ints[i] = json_integer_value(option_item);
	}

	if (is_string_array)
		*string_array = option_strings;
	else
		*int_array = option_ints;

	json_decref(root);
	return 1;
}